

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

ostream * operator<<(ostream *out,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  
  std::operator<<(out,"[");
  uVar4 = 0;
  while( true ) {
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)pdVar2 - (long)pdVar1 >> 3) - 1U <= uVar4) break;
    poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar4]);
    std::operator<<(poVar3,", ");
    uVar4 = uVar4 + 1;
  }
  poVar3 = std::ostream::_M_insert<double>(pdVar2[-1]);
  std::operator<<(poVar3,"]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}